

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O2

void uavs3d_if_hor_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar25;
  
  uVar15 = 0;
  uVar14 = (ulong)(uint)width;
  if (width < 1) {
    uVar14 = uVar15;
  }
  if (height < 1) {
    height = 0;
  }
  for (; (int)uVar15 != height; uVar15 = (ulong)((int)uVar15 + 1)) {
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      uVar1 = *(ulong *)(src + (uVar12 - 3));
      auVar2._8_6_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2[0xe] = (char)(uVar1 >> 0x38);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3[0xc] = (char)(uVar1 >> 0x30);
      auVar3._13_2_ = auVar2._13_2_;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar1;
      auVar4._12_3_ = auVar3._12_3_;
      auVar5._8_2_ = 0;
      auVar5._0_8_ = uVar1;
      auVar5[10] = (char)(uVar1 >> 0x28);
      auVar5._11_4_ = auVar4._11_4_;
      auVar6._8_2_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6._10_5_ = auVar5._10_5_;
      auVar7[8] = (char)(uVar1 >> 0x20);
      auVar7._0_8_ = uVar1;
      auVar7._9_6_ = auVar6._9_6_;
      auVar9._7_8_ = 0;
      auVar9._0_7_ = auVar7._8_7_;
      auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
      auVar10[0] = (char)(uVar1 >> 0x18);
      auVar10._9_6_ = 0;
      auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
      auVar11[0] = (char)(uVar1 >> 0x10);
      auVar11._11_4_ = 0;
      auVar8[2] = (char)(uVar1 >> 8);
      auVar8._0_2_ = (ushort)uVar1;
      auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
      auVar24._0_2_ = (ushort)uVar1 & 0xff;
      auVar24._2_13_ = auVar8._2_13_;
      auVar24[0xf] = 0;
      uVar1 = *(ulong *)coeff;
      uVar25 = (undefined1)(uVar1 >> 0x38);
      auVar22._8_6_ = 0;
      auVar22._0_8_ = uVar1;
      auVar22[0xe] = uVar25;
      auVar22[0xf] = uVar25;
      uVar25 = (undefined1)(uVar1 >> 0x30);
      auVar21._14_2_ = auVar22._14_2_;
      auVar21._8_5_ = 0;
      auVar21._0_8_ = uVar1;
      auVar21[0xd] = uVar25;
      auVar20._13_3_ = auVar21._13_3_;
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar1;
      auVar20[0xc] = uVar25;
      uVar25 = (undefined1)(uVar1 >> 0x28);
      auVar19._12_4_ = auVar20._12_4_;
      auVar19._8_3_ = 0;
      auVar19._0_8_ = uVar1;
      auVar19[0xb] = uVar25;
      auVar18._11_5_ = auVar19._11_5_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar1;
      auVar18[10] = uVar25;
      uVar25 = (undefined1)(uVar1 >> 0x20);
      auVar17._10_6_ = auVar18._10_6_;
      auVar17[8] = 0;
      auVar17._0_8_ = uVar1;
      auVar17[9] = uVar25;
      auVar16._9_7_ = auVar17._9_7_;
      auVar16[8] = uVar25;
      auVar16._0_8_ = uVar1;
      uVar25 = (undefined1)(uVar1 >> 0x18);
      auVar23._8_8_ = auVar16._8_8_;
      auVar23[7] = uVar25;
      auVar23[6] = uVar25;
      uVar25 = (undefined1)(uVar1 >> 0x10);
      auVar23[5] = uVar25;
      auVar23[4] = uVar25;
      uVar25 = (undefined1)(uVar1 >> 8);
      auVar23[3] = uVar25;
      auVar23[2] = uVar25;
      auVar23[0] = (undefined1)uVar1;
      auVar23[1] = auVar23[0];
      auVar23 = psraw(auVar23,8);
      auVar24 = pmaddwd(auVar23,auVar24);
      iVar13 = auVar24._12_4_ + auVar24._4_4_ + auVar24._8_4_ + auVar24._0_4_ + 0x20 >> 6;
      if (max_val <= iVar13) {
        iVar13 = max_val;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      dst[uVar12] = (pel)iVar13;
    }
    src = src + i_src;
    dst = dst + i_dst;
  }
  return;
}

Assistant:

static void uavs3d_if_hor_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_HOR(src, col, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}